

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplace<QStyleSheetStyleCaches::Tampered<QFont>const&>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,QWidget **key,
          Tampered<QFont> *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  Tampered<QFont> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_0038788e:
    pDVar2 = *(Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
               **)this;
    local_40._0_8_ = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
                    *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::
               Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
               ::detached(pDVar2);
      *(Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> **)this
           = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>(this,key,args);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::~QHash
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)&local_40);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      if ((pDVar1 != (Data *)0x0) && (*(uint *)&pDVar1->ref != 0xffffffff)) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_0038788e;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0038791c;
    }
    QFont::QFont(&local_40.oldWidgetValue,&args->oldWidgetValue);
    local_40.resolveMask = args->resolveMask;
    pVar3 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>>(this,key,&local_40);
    QFont::~QFont(&local_40.oldWidgetValue);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_0038791c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }